

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args.hxx
# Opt level: O3

FlagBase * __thiscall args::HelpFlag::Match(HelpFlag *this,char arg)

{
  FlagBase *pFVar1;
  runtime_error *this_00;
  undefined1 *local_40 [2];
  undefined1 local_30 [16];
  
  pFVar1 = FlagBase::Match((FlagBase *)this,arg);
  if (pFVar1 == (FlagBase *)0x0) {
    return (FlagBase *)0x0;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  local_40[0] = local_30;
  std::__cxx11::string::_M_construct((ulong)local_40,'\x01');
  std::runtime_error::runtime_error(this_00,(string *)local_40);
  *(undefined ***)this_00 = &PTR__runtime_error_00121a28;
  __cxa_throw(this_00,&Help::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

virtual FlagBase *Match(const char arg) override
            {
                if (FlagBase::Match(arg))
                {
#ifdef ARGS_NOEXCEPT
                    error = Error::Help;
                    return this;
#else
                    throw Help(std::string(1, arg));
#endif
                }
                return nullptr;
            }